

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindowlayout_p.cpp
# Opt level: O1

void QMainWindowLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QWidget *pQVar1;
  QDockAreaLayoutInfo *this;
  QDockWidget *_t1;
  QWidget *this_00;
  QDockWidgetGroupWindow *this_01;
  int __sig;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      tabMoved((QMainWindowLayout *)_o,*_a[1],*_a[2]);
      return;
    }
    if (_id == 1) {
      QObject::sender();
      pQVar1 = (QWidget *)QMetaObject::cast((QObject *)&QTabBar::staticMetaObject);
      if (pQVar1 != (QWidget *)0x0) {
        this = dockInfo((QMainWindowLayout *)_o,pQVar1);
        if (this != (QDockAreaLayoutInfo *)0x0) {
          _t1 = QDockAreaLayoutInfo::apply(this,false);
          if (_t1 != (QDockWidget *)0x0) {
            this_00 = QLayout::parentWidget((QLayout *)_o);
            QMainWindow::tabifiedDockWidgetActivated((QMainWindow *)this_00,_t1);
          }
          __sig = (int)*(undefined8 *)(*(long *)&pQVar1->field_0x8 + 0x10);
          this_01 = (QDockWidgetGroupWindow *)
                    QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
          if (this_01 != (QDockWidgetGroupWindow *)0x0) {
            QDockWidgetGroupWindow::adjustFlags(this_01);
          }
          if (*(long **)(_o + 0x1c0) == (long *)0x0) {
            pQVar1 = (QWidget *)0x0;
          }
          else {
            pQVar1 = (QWidget *)(**(code **)(**(long **)(_o + 0x1c0) + 0x68))();
          }
          if (pQVar1 != (QWidget *)0x0) {
            QWidget::raise(pQVar1,__sig);
            return;
          }
        }
      }
      return;
    }
    if (_id == 0) {
      updateGapIndicator((QMainWindowLayout *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QMainWindowLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMainWindowLayout *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updateGapIndicator(); break;
        case 1: _t->tabChanged(); break;
        case 2: _t->tabMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    }
}